

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int tinyexr::ParseEXRHeader
              (HeaderInfo *info,bool *empty_header,EXRVersion *version,string *err,uchar *buf,
              size_t size)

{
  pointer *pp_Var1;
  byte bVar2;
  float fVar3;
  pointer p_Var4;
  pointer pCVar5;
  char cVar6;
  size_type sVar7;
  bool bVar8;
  int iVar9;
  undefined8 uVar10;
  char *pcVar11;
  string *psVar12;
  long lVar13;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string attr_name;
  string attr_type;
  size_t marker_size;
  EXRAttribute attrib;
  int local_324;
  undefined1 local_318 [16];
  pointer local_308;
  string local_2f8;
  ulong local_2d8;
  string *local_2d0;
  ulong local_2c8;
  ulong local_2c0;
  ulong local_2b8;
  ulong local_2b0;
  ulong local_2a8;
  ulong local_2a0;
  ulong local_298;
  EXRVersion *local_290;
  string local_288;
  iterator local_268;
  pointer local_260;
  vector<_EXRAttribute,std::allocator<_EXRAttribute>> *local_258;
  size_t local_250;
  size_t local_248;
  _EXRAttribute local_240;
  
  if (empty_header != (bool *)0x0) {
    *empty_header = false;
  }
  if (((size == 0) || (version->multipart == 0)) || (*buf != '\0')) {
    info->display_window[2] = 0;
    info->display_window[3] = 0;
    info->screen_window_center[0] = 0.0;
    info->screen_window_center[1] = 0.0;
    info->line_order = 0;
    info->display_window[0] = 0;
    info->display_window[1] = 0;
    info->display_window[2] = 0;
    info->data_window[0] = 0;
    info->data_window[1] = 0;
    info->data_window[2] = 0;
    info->data_window[3] = 0;
    info->screen_window_width = -1.0;
    info->pixel_aspect_ratio = -1.0;
    info->tile_size_x = -1;
    info->tile_size_y = -1;
    info->tile_level_mode = -1;
    info->tile_rounding_mode = -1;
    p_Var4 = (info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl
        .super__Vector_impl_data._M_finish != p_Var4) {
      (info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
      super__Vector_impl_data._M_finish = p_Var4;
    }
    local_258 = (vector<_EXRAttribute,std::allocator<_EXRAttribute>> *)&info->attributes;
    lVar13 = 0x400;
    local_2c8 = 0;
    local_2c0 = 0;
    local_2b8 = 0;
    local_2b0 = 0;
    local_2a8 = 0;
    local_2a0 = 0;
    local_2d8 = 0;
    local_298 = 0;
    local_2d0 = err;
    local_290 = version;
    local_250 = size;
    do {
      psVar12 = local_2d0;
      if (size == 0) {
        if (local_2d0 == (string *)0x0) {
          return -4;
        }
        std::__cxx11::string::append((char *)local_2d0);
        return -4;
      }
      if (*buf == '\0') {
        size = size - 1;
        break;
      }
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      local_2f8._M_string_length = 0;
      local_2f8.field_2._M_local_buf[0] = '\0';
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      local_288._M_string_length = 0;
      local_288.field_2._M_local_buf[0] = '\0';
      local_308 = (pointer)0x0;
      local_318 = (undefined1  [16])0x0;
      bVar8 = ReadAttribute(&local_2f8,&local_288,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_318,
                            &local_248,(char *)buf,size);
      if (bVar8) {
        buf = buf + local_248;
        size = size - local_248;
        if ((local_290->tiled == 0) ||
           (iVar9 = std::__cxx11::string::compare((char *)&local_2f8), iVar9 != 0)) {
          iVar9 = std::__cxx11::string::compare((char *)&local_2f8);
          if (iVar9 == 0) {
            bVar2 = *(byte *)local_318._0_8_;
            if (bVar2 < 5) {
              info->compression_type = (uint)bVar2;
              bVar8 = true;
              local_2d8 = 1;
            }
            else {
              if (bVar2 == 0x80) {
                pcVar11 = "ZFP compression is not supported.";
              }
              else {
                pcVar11 = "Unknown compression type.";
              }
              if (psVar12 == (string *)0x0) {
                local_324 = -8;
                goto LAB_0013856c;
              }
              bVar8 = false;
              std::__cxx11::string::_M_replace
                        ((ulong)psVar12,0,(char *)psVar12->_M_string_length,(ulong)pcVar11);
              local_324 = -8;
            }
          }
          else {
            iVar9 = std::__cxx11::string::compare((char *)&local_2f8);
            if (iVar9 == 0) {
              bVar8 = ReadChannelInfo(&info->channels,
                                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_318);
              if (bVar8) {
                pCVar5 = (info->channels).
                         super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                bVar8 = true;
                psVar12 = local_2d0;
                if (pCVar5 != (info->channels).
                              super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start) {
                  local_298 = CONCAT71((int7)((ulong)pCVar5 >> 8),1);
                  goto LAB_0013856e;
                }
              }
              if (psVar12 != (string *)0x0) {
                std::__cxx11::string::append((char *)psVar12);
              }
              local_324 = -4;
              goto LAB_0013856c;
            }
            iVar9 = std::__cxx11::string::compare((char *)&local_2f8);
            if (iVar9 == 0) {
              bVar8 = true;
              if (0xf < (ulong)(local_318._8_8_ - local_318._0_8_)) {
                info->data_window[0] = *(int *)local_318._0_8_;
                info->data_window[1] = *(int *)(local_318._0_8_ + 4);
                info->data_window[2] = *(int *)(local_318._0_8_ + 8);
                iVar9 = *(int *)(local_318._0_8_ + 0xc);
                info->data_window[3] = iVar9;
                bVar8 = true;
                local_2a0 = CONCAT71((uint7)(uint3)((uint)iVar9 >> 8),1);
              }
            }
            else {
              iVar9 = std::__cxx11::string::compare((char *)&local_2f8);
              if (iVar9 == 0) {
                bVar8 = true;
                if (0xf < (ulong)(local_318._8_8_ - local_318._0_8_)) {
                  info->display_window[0] = *(int *)local_318._0_8_;
                  info->display_window[1] = *(int *)(local_318._0_8_ + 4);
                  info->display_window[2] = *(int *)(local_318._0_8_ + 8);
                  iVar9 = *(int *)(local_318._0_8_ + 0xc);
                  info->display_window[3] = iVar9;
                  bVar8 = true;
                  local_2a8 = CONCAT71((uint7)(uint3)((uint)iVar9 >> 8),1);
                }
              }
              else {
                iVar9 = std::__cxx11::string::compare((char *)&local_2f8);
                if (iVar9 == 0) {
                  if (local_318._8_8_ == local_318._0_8_) goto LAB_00138642;
                  info->line_order = (uint)*(byte *)local_318._0_8_;
                  bVar8 = true;
                  local_2b0 = 1;
                }
                else {
                  iVar9 = std::__cxx11::string::compare((char *)&local_2f8);
                  if (iVar9 == 0) {
                    bVar8 = true;
                    if (3 < (ulong)(local_318._8_8_ - local_318._0_8_)) {
                      fVar3 = *(float *)local_318._0_8_;
                      info->pixel_aspect_ratio = fVar3;
                      bVar8 = true;
                      local_2b8 = CONCAT71((uint7)(uint3)((uint)fVar3 >> 8),1);
                    }
                  }
                  else {
                    iVar9 = std::__cxx11::string::compare((char *)&local_2f8);
                    if (iVar9 == 0) {
                      bVar8 = true;
                      if (7 < (ulong)(local_318._8_8_ - local_318._0_8_)) {
                        info->screen_window_center[0] = *(float *)local_318._0_8_;
                        fVar3 = *(float *)(local_318._0_8_ + 4);
                        info->screen_window_center[1] = fVar3;
                        bVar8 = true;
                        local_2c0 = CONCAT71((uint7)(uint3)((uint)fVar3 >> 8),1);
                      }
                    }
                    else {
                      iVar9 = std::__cxx11::string::compare((char *)&local_2f8);
                      if (iVar9 == 0) {
                        bVar8 = true;
                        if (3 < (ulong)(local_318._8_8_ - local_318._0_8_)) {
                          fVar3 = *(float *)local_318._0_8_;
                          info->screen_window_width = fVar3;
                          bVar8 = true;
                          local_2c8 = CONCAT71((uint7)(uint3)((uint)fVar3 >> 8),1);
                        }
                      }
                      else {
                        iVar9 = std::__cxx11::string::compare((char *)&local_2f8);
                        if (iVar9 == 0) {
                          bVar8 = true;
                          if (3 < (ulong)(local_318._8_8_ - local_318._0_8_)) {
                            info->chunk_count = *(int *)local_318._0_8_;
                          }
                        }
                        else {
                          p_Var4 = (info->attributes).
                                   super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                          bVar8 = true;
                          if ((ulong)(((long)p_Var4 -
                                       (long)(info->attributes).
                                             super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                     0xf83e0f83e0f83e1) < 0x80) {
                            local_268._M_current = p_Var4;
                            strncpy(local_240.name,local_2f8._M_dataplus._M_p,0xff);
                            strncpy(local_240.type,local_288._M_dataplus._M_p,0xff);
                            local_240.name[0xff] = '\0';
                            local_240.type[0xff] = '\0';
                            local_260 = (pointer)local_318._0_8_;
                            uVar10 = local_318._8_8_;
                            local_240.size = (int)(local_318._8_8_ - local_318._0_8_);
                            local_240.value = (uchar *)malloc(local_318._8_8_ - local_318._0_8_);
                            if (uVar10 - (long)local_260 == 0) {
                              uVar10 = std::__throw_out_of_range_fmt
                                                 ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                                  ,0,0);
                              if ((pointer)local_318._0_8_ != (pointer)0x0) {
                                operator_delete((void *)local_318._0_8_,
                                                (long)local_308 - local_318._0_8_);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_288._M_dataplus._M_p != &local_288.field_2) {
                                operator_delete(local_288._M_dataplus._M_p,
                                                CONCAT71(local_288.field_2._M_allocated_capacity.
                                                         _1_7_,local_288.field_2._M_local_buf[0]) +
                                                1);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
                                operator_delete(local_2f8._M_dataplus._M_p,
                                                CONCAT71(local_2f8.field_2._M_allocated_capacity.
                                                         _1_7_,local_2f8.field_2._M_local_buf[0]) +
                                                1);
                              }
                              _Unwind_Resume(uVar10);
                            }
                            memcpy(local_240.value,local_260,uVar10 - (long)local_260);
                            if (local_268._M_current ==
                                (info->attributes).
                                super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage) {
                              std::vector<_EXRAttribute,std::allocator<_EXRAttribute>>::
                              _M_realloc_insert<_EXRAttribute_const&>
                                        (local_258,local_268,&local_240);
                            }
                            else {
                              memcpy(local_268._M_current,&local_240,0x210);
                              pp_Var1 = &(info->attributes).
                                         super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>
                                         ._M_impl.super__Vector_impl_data._M_finish;
                              *pp_Var1 = *pp_Var1 + 1;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          if (local_318._8_8_ - local_318._0_8_ != 9) {
            __assert_fail("data.size() == 9",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/ThirdParty/tinyexr.h"
                          ,0x290b,
                          "int tinyexr::ParseEXRHeader(HeaderInfo *, bool *, const EXRVersion *, std::string *, const unsigned char *, size_t)"
                         );
          }
          bVar2 = *(byte *)(local_318._0_8_ + 8);
          uVar10 = *(undefined8 *)local_318._0_8_;
          info->tile_size_x = (int)uVar10;
          info->tile_size_y = (int)((ulong)uVar10 >> 0x20);
          info->tile_level_mode = bVar2 & 3;
          info->tile_rounding_mode = bVar2 >> 4 & 1;
LAB_00138642:
          bVar8 = true;
        }
      }
      else {
        local_324 = -4;
        if (psVar12 != (string *)0x0) {
          std::__cxx11::string::append((char *)psVar12);
        }
LAB_0013856c:
        bVar8 = false;
      }
LAB_0013856e:
      if ((pointer)local_318._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_318._0_8_,(long)local_308 - local_318._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,
                        CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                 local_288.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,
                        CONCAT71(local_2f8.field_2._M_allocated_capacity._1_7_,
                                 local_2f8.field_2._M_local_buf[0]) + 1);
      }
      if (!bVar8) {
        return local_324;
      }
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
    psVar12 = local_2d0;
    std::__cxx11::stringstream::stringstream((stringstream *)&local_240);
    if ((local_2d8 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_240.name + 0x10),
                 "\"compression\" attribute not found in the header.",0x30);
      cVar6 = (char)(ostream *)(local_240.name + 0x10);
      std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
    }
    if ((local_298 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_240.name + 0x10),
                 "\"channels\" attribute not found in the header.",0x2d);
      cVar6 = (char)(ostream *)(local_240.name + 0x10);
      std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
    }
    if ((local_2b0 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_240.name + 0x10),
                 "\"lineOrder\" attribute not found in the header.",0x2e);
      cVar6 = (char)(ostream *)(local_240.name + 0x10);
      std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
    }
    if ((local_2a8 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_240.name + 0x10),
                 "\"displayWindow\" attribute not found in the header.",0x32);
      cVar6 = (char)(ostream *)(local_240.name + 0x10);
      std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
    }
    if ((local_2a0 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_240.name + 0x10),
                 "\"dataWindow\" attribute not found in the header or invalid.",0x3a);
      cVar6 = (char)(ostream *)(local_240.name + 0x10);
      std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
    }
    if ((local_2b8 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_240.name + 0x10),
                 "\"pixelAspectRatio\" attribute not found in the header.",0x35);
      cVar6 = (char)(ostream *)(local_240.name + 0x10);
      std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
    }
    if ((local_2c8 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_240.name + 0x10),
                 "\"screenWindowWidth\" attribute not found in the header.",0x36);
      cVar6 = (char)(ostream *)(local_240.name + 0x10);
      std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
    }
    if ((local_2c0 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_240.name + 0x10),
                 "\"screenWindowCenter\" attribute not found in the header.",0x37);
      cVar6 = (char)(ostream *)(local_240.name + 0x10);
      std::ios::widen((char)*(undefined8 *)(local_240.name._16_8_ + -0x18) + cVar6);
      std::ostream::put(cVar6);
      std::ostream::flush();
    }
    std::__cxx11::stringbuf::str();
    sVar7 = local_2f8._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,
                      CONCAT71(local_2f8.field_2._M_allocated_capacity._1_7_,
                               local_2f8.field_2._M_local_buf[0]) + 1);
    }
    iVar9 = -9;
    if (sVar7 == 0) {
      iVar9 = local_324;
    }
    if (sVar7 != 0 && psVar12 != (string *)0x0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)local_2d0,(ulong)local_2f8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,
                        CONCAT71(local_2f8.field_2._M_allocated_capacity._1_7_,
                                 local_2f8.field_2._M_local_buf[0]) + 1);
      }
      iVar9 = -9;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_240);
    std::ios_base::~ios_base((ios_base *)(local_240.name + 0x80));
    if (sVar7 == 0) {
      info->header_len = (int)local_250 - (int)size;
      iVar9 = 0;
    }
  }
  else {
    iVar9 = 0;
    if (empty_header != (bool *)0x0) {
      *empty_header = true;
    }
  }
  return iVar9;
}

Assistant:

static int ParseEXRHeader(HeaderInfo *info, bool *empty_header,
                          const EXRVersion *version, std::string *err,
                          const unsigned char *buf, size_t size) {
  const char *marker = reinterpret_cast<const char *>(&buf[0]);

  if (empty_header) {
    (*empty_header) = false;
  }

  if (version->multipart) {
    if (size > 0 && marker[0] == '\0') {
      // End of header list.
      if (empty_header) {
        (*empty_header) = true;
      }
      return TINYEXR_SUCCESS;
    }
  }

  // According to the spec, the header of every OpenEXR file must contain at
  // least the following attributes:
  //
  // channels chlist
  // compression compression
  // dataWindow box2i
  // displayWindow box2i
  // lineOrder lineOrder
  // pixelAspectRatio float
  // screenWindowCenter v2f
  // screenWindowWidth float
  bool has_channels = false;
  bool has_compression = false;
  bool has_data_window = false;
  bool has_display_window = false;
  bool has_line_order = false;
  bool has_pixel_aspect_ratio = false;
  bool has_screen_window_center = false;
  bool has_screen_window_width = false;

  info->data_window[0] = 0;
  info->data_window[1] = 0;
  info->data_window[2] = 0;
  info->data_window[3] = 0;
  info->line_order = 0;  // @fixme
  info->display_window[0] = 0;
  info->display_window[1] = 0;
  info->display_window[2] = 0;
  info->display_window[3] = 0;
  info->screen_window_center[0] = 0.0f;
  info->screen_window_center[1] = 0.0f;
  info->screen_window_width = -1.0f;
  info->pixel_aspect_ratio = -1.0f;

  info->tile_size_x = -1;
  info->tile_size_y = -1;
  info->tile_level_mode = -1;
  info->tile_rounding_mode = -1;

  info->attributes.clear();

  // Read attributes
  size_t orig_size = size;
  for (size_t nattr = 0; nattr < TINYEXR_MAX_HEADER_ATTRIBUTES; nattr++) {
    if (0 == size) {
      if (err) {
        (*err) += "Insufficient data size for attributes.\n";
      }
      return TINYEXR_ERROR_INVALID_DATA;
    } else if (marker[0] == '\0') {
      size--;
      break;
    }

    std::string attr_name;
    std::string attr_type;
    std::vector<unsigned char> data;
    size_t marker_size;
    if (!tinyexr::ReadAttribute(&attr_name, &attr_type, &data, &marker_size,
                                marker, size)) {
      if (err) {
        (*err) += "Failed to read attribute.\n";
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }
    marker += marker_size;
    size -= marker_size;

    if (version->tiled && attr_name.compare("tiles") == 0) {
      unsigned int x_size, y_size;
      unsigned char tile_mode;
      TEXR_ASSERT(data.size() == 9);
      memcpy(&x_size, &data.at(0), sizeof(int));
      memcpy(&y_size, &data.at(4), sizeof(int));
      tile_mode = data[8];
      tinyexr::swap4(&x_size);
      tinyexr::swap4(&y_size);

      info->tile_size_x = static_cast<int>(x_size);
      info->tile_size_y = static_cast<int>(y_size);

      // mode = levelMode + roundingMode * 16
      info->tile_level_mode = tile_mode & 0x3;
      info->tile_rounding_mode = (tile_mode >> 4) & 0x1;

    } else if (attr_name.compare("compression") == 0) {
      bool ok = false;
      if (data[0] < TINYEXR_COMPRESSIONTYPE_PIZ) {
        ok = true;
      }

      if (data[0] == TINYEXR_COMPRESSIONTYPE_PIZ) {
#if TINYEXR_USE_PIZ
        ok = true;
#else
        if (err) {
          (*err) = "PIZ compression is not supported.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
#endif
      }

      if (data[0] == TINYEXR_COMPRESSIONTYPE_ZFP) {
#if TINYEXR_USE_ZFP
        ok = true;
#else
        if (err) {
          (*err) = "ZFP compression is not supported.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
#endif
      }

      if (!ok) {
        if (err) {
          (*err) = "Unknown compression type.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
      }

      info->compression_type = static_cast<int>(data[0]);
      has_compression = true;

    } else if (attr_name.compare("channels") == 0) {
      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      if (!ReadChannelInfo(info->channels, data)) {
        if (err) {
          (*err) += "Failed to parse channel info.\n";
        }
        return TINYEXR_ERROR_INVALID_DATA;
      }

      if (info->channels.size() < 1) {
        if (err) {
          (*err) += "# of channels is zero.\n";
        }
        return TINYEXR_ERROR_INVALID_DATA;
      }

      has_channels = true;

    } else if (attr_name.compare("dataWindow") == 0) {
      if (data.size() >= 16) {
        memcpy(&info->data_window[0], &data.at(0), sizeof(int));
        memcpy(&info->data_window[1], &data.at(4), sizeof(int));
        memcpy(&info->data_window[2], &data.at(8), sizeof(int));
        memcpy(&info->data_window[3], &data.at(12), sizeof(int));
        tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->data_window[0]));
        tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->data_window[1]));
        tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->data_window[2]));
        tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->data_window[3]));
        has_data_window = true;
      }
    } else if (attr_name.compare("displayWindow") == 0) {
      if (data.size() >= 16) {
        memcpy(&info->display_window[0], &data.at(0), sizeof(int));
        memcpy(&info->display_window[1], &data.at(4), sizeof(int));
        memcpy(&info->display_window[2], &data.at(8), sizeof(int));
        memcpy(&info->display_window[3], &data.at(12), sizeof(int));
        tinyexr::swap4(
            reinterpret_cast<unsigned int *>(&info->display_window[0]));
        tinyexr::swap4(
            reinterpret_cast<unsigned int *>(&info->display_window[1]));
        tinyexr::swap4(
            reinterpret_cast<unsigned int *>(&info->display_window[2]));
        tinyexr::swap4(
            reinterpret_cast<unsigned int *>(&info->display_window[3]));

        has_display_window = true;
      }
    } else if (attr_name.compare("lineOrder") == 0) {
      if (data.size() >= 1) {
        info->line_order = static_cast<int>(data[0]);
        has_line_order = true;
      }
    } else if (attr_name.compare("pixelAspectRatio") == 0) {
      if (data.size() >= sizeof(float)) {
        memcpy(&info->pixel_aspect_ratio, &data.at(0), sizeof(float));
        tinyexr::swap4(
            reinterpret_cast<unsigned int *>(&info->pixel_aspect_ratio));
        has_pixel_aspect_ratio = true;
      }
    } else if (attr_name.compare("screenWindowCenter") == 0) {
      if (data.size() >= 8) {
        memcpy(&info->screen_window_center[0], &data.at(0), sizeof(float));
        memcpy(&info->screen_window_center[1], &data.at(4), sizeof(float));
        tinyexr::swap4(
            reinterpret_cast<unsigned int *>(&info->screen_window_center[0]));
        tinyexr::swap4(
            reinterpret_cast<unsigned int *>(&info->screen_window_center[1]));
        has_screen_window_center = true;
      }
    } else if (attr_name.compare("screenWindowWidth") == 0) {
      if (data.size() >= sizeof(float)) {
        memcpy(&info->screen_window_width, &data.at(0), sizeof(float));
        tinyexr::swap4(
            reinterpret_cast<unsigned int *>(&info->screen_window_width));

        has_screen_window_width = true;
      }
    } else if (attr_name.compare("chunkCount") == 0) {
      if (data.size() >= sizeof(int)) {
        memcpy(&info->chunk_count, &data.at(0), sizeof(int));
        tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->chunk_count));
      }
    } else {
      // Custom attribute(up to TINYEXR_MAX_CUSTOM_ATTRIBUTES)
      if (info->attributes.size() < TINYEXR_MAX_CUSTOM_ATTRIBUTES) {
        EXRAttribute attrib;
#ifdef _MSC_VER
        strncpy_s(attrib.name, attr_name.c_str(), 255);
        strncpy_s(attrib.type, attr_type.c_str(), 255);
#else
        strncpy(attrib.name, attr_name.c_str(), 255);
        strncpy(attrib.type, attr_type.c_str(), 255);
#endif
        attrib.name[255] = '\0';
        attrib.type[255] = '\0';
        attrib.size = static_cast<int>(data.size());
        attrib.value = static_cast<unsigned char *>(malloc(data.size()));
        memcpy(reinterpret_cast<char *>(attrib.value), &data.at(0),
               data.size());
        info->attributes.push_back(attrib);
      }
    }
  }

  // Check if required attributes exist
  {
    std::stringstream ss_err;

    if (!has_compression) {
      ss_err << "\"compression\" attribute not found in the header."
             << std::endl;
    }

    if (!has_channels) {
      ss_err << "\"channels\" attribute not found in the header." << std::endl;
    }

    if (!has_line_order) {
      ss_err << "\"lineOrder\" attribute not found in the header." << std::endl;
    }

    if (!has_display_window) {
      ss_err << "\"displayWindow\" attribute not found in the header."
             << std::endl;
    }

    if (!has_data_window) {
      ss_err << "\"dataWindow\" attribute not found in the header or invalid."
             << std::endl;
    }

    if (!has_pixel_aspect_ratio) {
      ss_err << "\"pixelAspectRatio\" attribute not found in the header."
             << std::endl;
    }

    if (!has_screen_window_width) {
      ss_err << "\"screenWindowWidth\" attribute not found in the header."
             << std::endl;
    }

    if (!has_screen_window_center) {
      ss_err << "\"screenWindowCenter\" attribute not found in the header."
             << std::endl;
    }

    if (!(ss_err.str().empty())) {
      if (err) {
        (*err) += ss_err.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }
  }

  info->header_len = static_cast<unsigned int>(orig_size - size);

  return TINYEXR_SUCCESS;
}